

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

void __thiscall
Fl_Text_Buffer::add_modify_callback
          (Fl_Text_Buffer *this,Fl_Text_Modify_Cb bufModifiedCB,void *cbArg)

{
  uint uVar1;
  Fl_Text_Modify_Cb *pp_Var2;
  Fl_Text_Modify_Cb *pp_Var3;
  void **ppvVar4;
  ulong uVar5;
  ulong uVar6;
  void **ppvVar7;
  
  uVar1 = this->mNModifyProcs;
  uVar5 = 0xffffffffffffffff;
  if (-2 < (long)(int)uVar1) {
    uVar5 = (long)(int)uVar1 * 8 + 8;
  }
  pp_Var3 = (Fl_Text_Modify_Cb *)operator_new__(uVar5);
  ppvVar4 = (void **)operator_new__(uVar5);
  pp_Var2 = this->mModifyProcs;
  ppvVar7 = this->mCbArgs;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pp_Var3[uVar5 + 1] = pp_Var2[uVar5];
    ppvVar4[uVar5 + 1] = ppvVar7[uVar5];
  }
  if (uVar1 != 0) {
    if (pp_Var2 != (Fl_Text_Modify_Cb *)0x0) {
      operator_delete__(pp_Var2);
      ppvVar7 = this->mCbArgs;
    }
    if (ppvVar7 != (void **)0x0) {
      operator_delete__(ppvVar7);
    }
  }
  *pp_Var3 = bufModifiedCB;
  *ppvVar4 = cbArg;
  this->mNModifyProcs = this->mNModifyProcs + 1;
  this->mModifyProcs = pp_Var3;
  this->mCbArgs = ppvVar4;
  return;
}

Assistant:

void Fl_Text_Buffer::add_modify_callback(Fl_Text_Modify_Cb bufModifiedCB,
					 void *cbArg)
{
  Fl_Text_Modify_Cb *newModifyProcs =
  new Fl_Text_Modify_Cb[mNModifyProcs + 1];
  void **newCBArgs = new void *[mNModifyProcs + 1];
  for (int i = 0; i < mNModifyProcs; i++) {
    newModifyProcs[i + 1] = mModifyProcs[i];
    newCBArgs[i + 1] = mCbArgs[i];
  }
  if (mNModifyProcs != 0) {
    delete[]mModifyProcs;
    delete[]mCbArgs;
  }
  newModifyProcs[0] = bufModifiedCB;
  newCBArgs[0] = cbArg;
  mNModifyProcs++;
  mModifyProcs = newModifyProcs;
  mCbArgs = newCBArgs;
}